

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-trust-schema-pattern.c
# Opt level: O0

int ndn_trust_schema_pattern_from_string
              (ndn_trust_schema_pattern_t *pattern,char *string,uint32_t size)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int __length;
  int __length_00;
  ulong uVar5;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  re_registers *in_R8;
  undefined1 local_c8 [8];
  ndn_trust_schema_pattern_component_t component_1;
  int pattern_comp_string_len;
  int pattern_comp_end_index;
  int iStack_7c;
  uint8_t num_subpattern_indexes;
  uint32_t current_type;
  uint32_t last_type;
  char *current_string;
  undefined1 local_68 [5];
  uint8_t current_subpattern_capture_end_index;
  uint8_t current_subpattern_capture_begin_index;
  _Bool should_add_SPB;
  ndn_trust_schema_pattern_component_t component;
  int ret_val;
  uint32_t i;
  uint32_t size_local;
  char *string_local;
  ndn_trust_schema_pattern_t *pattern_local;
  
  uVar5 = (ulong)size;
  if (size == 0) {
    pattern_local._4_4_ = -0x9c;
  }
  else {
    ret_val = size;
    if (string[size - 1] == '\0') {
      ret_val = size - 1;
    }
    for (component.size = 0; component.size < ret_val - 1U; component.size = component.size + 1) {
      if (string[component.size] == '\0') {
        return -0x9d;
      }
    }
    component.value[0x30] = 0xff;
    component.value[0x31] = 0xff;
    component.subpattern_info = 0xff;
    component._55_1_ = 0xff;
    pattern->components_size = 0;
    if ((((*string == '<') || (*string == '(')) || (*string == '[')) || (*string == '\\')) {
      bVar2 = false;
      current_string._6_1_ = 0;
      current_string._5_1_ = 0;
      iStack_7c = 0;
      pattern_comp_end_index = 0;
      pattern_comp_string_len._3_1_ = '\0';
      _current_type = string;
      while (iVar3 = (int)string, (uint)((int)_current_type - iVar3) < (uint)ret_val) {
        component_1.size = 0xffffffff;
        cVar1 = *_current_type;
        __length = (int)uVar5;
        if (cVar1 == '(') {
          iVar3 = re_match((re_pattern_buffer *)")",_current_type,__length,iVar3,in_R8);
          if (iVar3 == TINY_REGEX_C_FAIL) {
            return -0x9e;
          }
          bVar2 = true;
          _current_type = _current_type + 1;
          uVar5 = extraout_RDX;
        }
        else if (cVar1 == ')') {
          uVar5 = (ulong)(current_string._5_1_ | 0x40);
          uVar4 = pattern->components_size - 1;
          pattern->components[uVar4].subpattern_info =
               pattern->components[uVar4].subpattern_info | (byte)(current_string._5_1_ | 0x40);
          current_string._5_1_ = current_string._5_1_ + 1;
          _current_type = _current_type + 1;
        }
        else {
          if (cVar1 == '<') {
            component_1.size =
                 re_match((re_pattern_buffer *)"^<>\\*",_current_type,__length,iVar3,in_R8);
            if (component_1.size == TINY_REGEX_C_FAIL) {
              component_1.size =
                   re_match((re_pattern_buffer *)0x12cfe2,_current_type,__length_00,iVar3,in_R8);
              if (component_1.size == TINY_REGEX_C_FAIL) {
                return -0x9e;
              }
              pattern_comp_end_index = 3;
              if (component_1.size == 2) {
                pattern_comp_end_index = 2;
              }
            }
            else {
              pattern_comp_end_index = 1;
              component_1.size = component_1.size + 2;
            }
          }
          else if (cVar1 == '[') {
            component_1.size =
                 re_match((re_pattern_buffer *)0x12d35e,_current_type,__length,iVar3,in_R8);
            if (component_1.size == TINY_REGEX_C_FAIL) {
              return -0x9e;
            }
            pattern_comp_end_index = 5;
          }
          else if (cVar1 == '\\') {
            component_1.size =
                 re_match((re_pattern_buffer *)"[0-9]",_current_type,__length,iVar3,in_R8);
            if (component_1.size == TINY_REGEX_C_FAIL) {
              return -0x9e;
            }
            pattern_comp_end_index = 4;
            pattern_comp_string_len._3_1_ = pattern_comp_string_len._3_1_ + '\x01';
          }
          else if (*_current_type != '\0') {
            return -0x9e;
          }
          if ((pattern_comp_end_index == 1) && (iStack_7c == 1)) {
            return -0x9f;
          }
          iStack_7c = pattern_comp_end_index;
          component_1._52_4_ = component_1.size + 1;
          component_1.value[0x2a] = '\0';
          component._52_4_ =
               ndn_trust_schema_pattern_component_from_string
                         ((ndn_trust_schema_pattern_component_t *)local_c8,_current_type,
                          component_1._52_4_);
          if (component._52_4_ != 0) {
            return component._52_4_;
          }
          if (bVar2) {
            component_1.value[0x2a] = component_1.value[0x2a] | current_string._6_1_ | 0x80;
            current_string._6_1_ = current_string._6_1_ + 1;
            if (5 < current_string._6_1_ + 1) {
              return -0xa0;
            }
            bVar2 = false;
          }
          iVar3 = ndn_trust_schema_pattern_append_component
                            (pattern,(ndn_trust_schema_pattern_component_t *)local_c8);
          if (iVar3 != 0) {
            return iVar3;
          }
          _current_type = _current_type + (int)(component_1.size + 1);
          component.value[0x30] = '\0';
          component.value[0x31] = '\0';
          component.subpattern_info = '\0';
          component._55_1_ = 0;
          uVar5 = extraout_RDX_00;
        }
      }
      if (current_string._6_1_ == current_string._5_1_) {
        pattern->num_subpattern_captures = current_string._6_1_;
        pattern->num_subpattern_indexes = pattern_comp_string_len._3_1_;
        pattern_local._4_4_ = 0;
      }
      else {
        pattern_local._4_4_ = -0x9e;
      }
    }
    else {
      component._52_4_ =
           ndn_trust_schema_pattern_component_from_string
                     ((ndn_trust_schema_pattern_component_t *)local_68,string,ret_val);
      pattern_local._4_4_ = component._52_4_;
      if ((component._52_4_ == 0) &&
         (pattern_local._4_4_ =
               ndn_trust_schema_pattern_append_component
                         (pattern,(ndn_trust_schema_pattern_component_t *)local_68),
         pattern_local._4_4_ == 0)) {
        pattern_local._4_4_ = 0;
      }
    }
  }
  return pattern_local._4_4_;
}

Assistant:

int
ndn_trust_schema_pattern_from_string(ndn_trust_schema_pattern_t* pattern,
                                     const char* string, uint32_t size)
{
  if (size == 0) return NDN_TRUST_SCHEMA_PATTERN_STRING_ZERO_LENGTH;

  if (string[size - 1] == '\0') size--;

  for (uint32_t i = 0; i < size - 1; i++) {
    if (string[i] == '\0')
      return NDN_TRUST_SCHEMA_PATTERN_STRING_PREMATURE_TERMINATION;
  }

  int ret_val = -1;

  pattern->components_size = 0;

  // first check if it's a rule reference
  if (string[0] != '<' && string[0] != '(' && string[0] != '['
      && string[0] != '\\') {
    ndn_trust_schema_pattern_component_t component;
    ret_val = ndn_trust_schema_pattern_component_from_string(&component, string, size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = ndn_trust_schema_pattern_append_component(pattern, &component);
    if (ret_val != NDN_SUCCESS) return ret_val;
    return 0;
  }

  // flag to remember whether the pattern component being appended should be
  // marked as the beginning of a subpattern (SPB = Sub Pattern Beginning)
  bool should_add_SPB = false;
  // current subpattern index; will return error if more than
  // NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES subpatterns are found
  uint8_t current_subpattern_capture_begin_index = 0;
  uint8_t current_subpattern_capture_end_index = 0;
  const char* current_string = string;
  uint32_t last_type = NDN_TRUST_SCHEMA_NO_TYPE;
  uint32_t current_type = NDN_TRUST_SCHEMA_NO_TYPE;
  uint8_t num_subpattern_indexes = 0;
  // iterate through the schema pattern
  while ((uint32_t)(current_string - string) < size) {
    int pattern_comp_end_index = -1;
    switch (current_string[0]) {
      case '<':
        pattern_comp_end_index = re_match("^<>\\*", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL) {
          pattern_comp_end_index = re_match(">", current_string);
          if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
            return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
          else
            current_type = (pattern_comp_end_index == 2)
                               ? NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT
                               : NDN_TRUST_SCHEMA_SINGLE_NAME_COMPONENT;
        } else {
          current_type = NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE;
          pattern_comp_end_index += 2;
        }
        break;
      case '[':
        pattern_comp_end_index = re_match("]", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        else
          current_type = NDN_TRUST_SCHEMA_WILDCARD_SPECIALIZER;
        break;
      case '\\':
        pattern_comp_end_index = re_match("[0-9]", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        else
          current_type = NDN_TRUST_SCHEMA_SUBPATTERN_INDEX;
        num_subpattern_indexes++;
        break;
      case '(':
        // make sure that there is a corresponding end parentheses for this
        // subpattern
        pattern_comp_end_index = re_match(")", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        should_add_SPB = true;
        current_string += 1;
        continue;
      case ')':
        // set the last pattern component's subpattern info to indicate that it
        // was the ending of a subpattern
        pattern->components[pattern->components_size - 1].subpattern_info |=
            (NDN_TRUST_SCHEMA_SUBPATTERN_END_ONLY << 6) |
            (current_subpattern_capture_end_index);
        current_subpattern_capture_end_index++;
        current_string += 1;
        continue;
      default:
        if (current_string[0] == '\0')
          break;
        else
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
    }

    // do not allow more than one consecutive wildcard name component sequences
    if (current_type == NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE
        && last_type == NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE)
      return NDN_TRUST_SCHEMA_PATTERN_INVALID_FORMAT;
    last_type = current_type;

    int pattern_comp_string_len = pattern_comp_end_index + 1;

    ndn_trust_schema_pattern_component_t component;
    component.subpattern_info = 0;
    ret_val = ndn_trust_schema_pattern_component_from_string(
        &component, current_string, pattern_comp_string_len);
    if (ret_val != NDN_SUCCESS) return ret_val;

    if (should_add_SPB) {
      // set the current pattern component's subpattern info to indicate that it
      // was the beginning of a subpattern
      component.subpattern_info |=
          (NDN_TRUST_SCHEMA_SUBPATTERN_BEGIN_ONLY << 6) |
          (current_subpattern_capture_begin_index);
      current_subpattern_capture_begin_index++;
      if (current_subpattern_capture_begin_index + 1 >
          NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES) {
        return NDN_TRUST_SCHEMA_NUMBER_OF_SUBPATTERNS_EXCEEDS_LIMIT;
      }
      should_add_SPB = false;
    }

    ret_val = ndn_trust_schema_pattern_append_component(pattern, &component);
    if (ret_val != NDN_SUCCESS) return ret_val;

    current_string += pattern_comp_end_index + 1;
  }

  if (current_subpattern_capture_begin_index !=
      current_subpattern_capture_end_index) {
    return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
  }

  pattern->num_subpattern_captures = current_subpattern_capture_begin_index;
  pattern->num_subpattern_indexes = num_subpattern_indexes;

  return 0;
}